

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O1

int b_extract(lua_State *L)

{
  lua_Unsigned lVar1;
  int iVar2;
  int w;
  char local_1c [4];
  
  lVar1 = luaL_checkunsigned(L,1);
  iVar2 = fieldargs(L,2,(int *)local_1c);
  lua_pushunsigned(L,~(-2 << (local_1c[0] - 1U & 0x1f)) & lVar1 >> ((byte)iVar2 & 0x1f));
  return 1;
}

Assistant:

static int b_extract (lua_State *L) {
  int w;
  b_uint r = luaL_checkunsigned(L, 1);
  int f = fieldargs(L, 2, &w);
  r = (r >> f) & mask(w);
  lua_pushunsigned(L, r);
  return 1;
}